

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O2

void __thiscall SparseArray<Value>::Set(SparseArray<Value> *this,uint32 index,Value *element)

{
  uint uVar1;
  SAChunk<Value> *pSVar2;
  SAChunk<Value> *pSVar3;
  uint32 lhs;
  
  uVar1 = this->chunkSize;
  pSVar3 = (SAChunk<Value> *)&this->firstChunk;
  while ((pSVar2 = pSVar3->next, pSVar2 != (SAChunk<Value> *)0x0 && (pSVar2->startIndex <= index)))
  {
    pSVar3 = pSVar2;
    if (index < pSVar2->startIndex + uVar1) {
LAB_00466563:
      (&pSVar2[1].next)[index % uVar1] = (SAChunk<Value> *)element;
      return;
    }
  }
  pSVar2 = (SAChunk<Value> *)Memory::ArenaAllocator::AllocZero(this->alloc,(ulong)uVar1 * 8 + 0x10);
  lhs = index - index % uVar1;
  pSVar2->startIndex = lhs;
  UInt32Math::Add(lhs,this->chunkSize);
  pSVar2->next = pSVar3->next;
  pSVar3->next = pSVar2;
  goto LAB_00466563;
}

Assistant:

void Set(uint32 index, T *element)
    {
        SAChunk<T> * chunk, **pPrev = &(this->firstChunk);
        uint32 indexInChunk = (index % this->chunkSize);

        for (chunk = this->firstChunk; chunk; chunk = chunk->next)
        {
            if (index < chunk->startIndex)
            {
                // Need a new chunk...
                chunk = NULL;
                break;
            }
            if (index < chunk->startIndex + this->chunkSize)
            {
                break;
            }
            pPrev = &(chunk->next);
        }

        if (chunk == NULL)
        {
            chunk = (SAChunk<T> *)this->alloc->AllocZero(sizeof(SAChunk<T>) + (chunkSize * sizeof(T *)));
            chunk->startIndex = index - indexInChunk;
            // Since startIndex and chunkSize don't change, check now if this overflows.
            // Cache the result or save memory ?
            UInt32Math::Add(chunk->startIndex, chunkSize);
            chunk->next = *pPrev;
            *pPrev = chunk;
        }
        chunk->data[indexInChunk] = element;
    }